

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::Compiler
          (Compiler *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *ir_)

{
  ParsedIR *ir__00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_858;
  undefined1 local_840 [8];
  Parser parser;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ir__local;
  Compiler *this_local;
  
  this->_vptr_Compiler = (_func_int **)&PTR__Compiler_010d7640;
  parser.forward_pointer_fixups.stack_storage.aligned_char._56_8_ = ir_;
  ParsedIR::ParsedIR(&this->ir);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->global_variables);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->aliased_variables);
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->current_loop_level = 0;
  ::std::
  unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
  ::unordered_set(&this->active_interface_variables);
  this->check_active_interface_variables = false;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->invalid_expressions);
  this->is_force_recompile = false;
  this->is_force_recompile_forward_progress = false;
  SmallVector<diligent_spirv_cross::CombinedImageSampler,_8UL>::SmallVector
            (&this->combined_image_samplers);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->global_struct_cache);
  ::std::
  function<void_(const_diligent_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->variable_remap_callback);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->forced_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->forwarded_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->suppressed_usage_tracking);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->hoisted_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->forced_invariant_temporaries);
  Bitset::Bitset(&this->active_input_builtins);
  Bitset::Bitset(&this->active_output_builtins);
  this->clip_distance_count = 0;
  this->cull_distance_count = 0;
  this->position_invariant = false;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->comparison_ids);
  this->need_subpass_input = false;
  this->need_subpass_input_ms = false;
  this->dummy_sampler_id = 0;
  ::std::
  unordered_map<unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>_>
  ::unordered_map(&this->function_cfgs);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->physical_storage_non_block_pointer_types);
  ::std::
  unordered_map<unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
  ::unordered_map(&this->physical_storage_type_to_alignment);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->interlocked_resources);
  this->interlocked_is_complex = false;
  ::std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->declared_block_names);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_858,ir_);
  Parser::Parser((Parser *)local_840,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_858);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_858);
  Parser::parse((Parser *)local_840);
  ir__00 = Parser::get_parsed_ir((Parser *)local_840);
  set_ir(this,ir__00);
  Parser::~Parser((Parser *)local_840);
  return;
}

Assistant:

Compiler::Compiler(vector<uint32_t> ir_)
{
	Parser parser(std::move(ir_));
	parser.parse();
	set_ir(std::move(parser.get_parsed_ir()));
}